

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_get_record_field_available_status
              (coda_cursor_conflict *cursor,long index,int *available)

{
  int iVar1;
  coda_type *local_40;
  int *local_38;
  long available_index;
  coda_type_record *record;
  int *available_local;
  long index_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_40 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_40 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  available_index = (long)local_40;
  record = (coda_type_record *)available;
  available_local = (int *)index;
  index_local = (long)cursor;
  if ((index < 0) || ((long)local_40[1].name <= index)) {
    coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",index,local_40[1].name);
    cursor_local._4_4_ = -1;
  }
  else {
    if (local_40[1].attributes == (coda_type_record *)0x0) {
      if (*(long *)(*(long *)(local_40[1].description + index * 8) + 0x20) == 0) {
        *available = 1;
      }
      else {
        iVar1 = coda_expression_eval_bool
                          (*(coda_expression **)
                            (*(long *)(local_40[1].description + index * 8) + 0x20),cursor,available
                          );
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    else {
      iVar1 = coda_cursor_get_available_union_field_index(cursor,(long *)&local_38);
      if (iVar1 != 0) {
        return -1;
      }
      record->format = (uint)(available_local == local_38);
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascbin_cursor_get_record_field_available_status(const coda_cursor *cursor, long index, int *available)
{
    coda_type_record *record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (index < 0 || index >= record->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       record->num_fields);
        return -1;
    }

    if (record->union_field_expr != NULL)
    {
        long available_index;

        if (coda_cursor_get_available_union_field_index(cursor, &available_index) != 0)
        {
            return -1;
        }
        *available = (index == available_index);
    }
    else if (record->field[index]->available_expr != NULL)
    {
        if (coda_expression_eval_bool(record->field[index]->available_expr, cursor, available) != 0)
        {
            return -1;
        }
    }
    else
    {
        *available = 1;
    }

    return 0;
}